

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O3

rfc5444_result
rfc5444_writer_add_addrtlv
          (rfc5444_writer *writer,rfc5444_writer_address *addr,rfc5444_writer_tlvtype *tlvtype,
          void *value,size_t length,_Bool allow_dup)

{
  uint8_t *puVar1;
  rfc5444_result rVar2;
  avl_node *paVar3;
  rfc5444_writer_addrtlv *prVar4;
  uint8_t *__dest;
  
  if (writer->_state != RFC5444_WRITER_ADD_ADDRESSES) {
    __assert_fail("writer->_state == RFC5444_WRITER_ADD_ADDRESSES",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0xc4,
                  "enum rfc5444_result rfc5444_writer_add_addrtlv(struct rfc5444_writer *, struct rfc5444_writer_address *, struct rfc5444_writer_tlvtype *, const void *, size_t, _Bool)"
                 );
  }
  if ((!allow_dup) &&
     (paVar3 = avl_find(&addr->_addrtlv_tree,&tlvtype->_full_type), paVar3 != (avl_node *)0x0)) {
    return RFC5444_DUPLICATE_TLV;
  }
  prVar4 = (*writer->malloc_addrtlv_entry)();
  if (prVar4 == (rfc5444_writer_addrtlv *)0x0) {
    return RFC5444_OUT_OF_MEMORY;
  }
  prVar4->address = addr;
  prVar4->tlvtype = tlvtype;
  prVar4->length = (uint16_t)length;
  if (length == 0) {
LAB_0014f5aa:
    (prVar4->addrtlv_node).key = &tlvtype->_full_type;
    avl_insert(&addr->_addrtlv_tree,&prVar4->addrtlv_node);
    rVar2 = RFC5444_OKAY;
  }
  else {
    if (writer->addrtlv_size < length + writer->_addrtlv_used) {
      prVar4->value = (void *)0x0;
    }
    else {
      puVar1 = writer->addrtlv_buffer;
      __dest = puVar1 + writer->_addrtlv_used;
      memcpy(__dest,value,length);
      writer->_addrtlv_used = writer->_addrtlv_used + length;
      prVar4->value = __dest;
      if (puVar1 != (uint8_t *)0x0) goto LAB_0014f5aa;
    }
    (*writer->free_addrtlv_entry)(prVar4);
    rVar2 = RFC5444_OUT_OF_ADDRTLV_MEM;
  }
  return rVar2;
}

Assistant:

enum rfc5444_result
rfc5444_writer_add_addrtlv(struct rfc5444_writer *writer, struct rfc5444_writer_address *addr,
  struct rfc5444_writer_tlvtype *tlvtype, const void *value, size_t length, bool allow_dup)
{
  struct rfc5444_writer_addrtlv *addrtlv;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_ADD_ADDRESSES);
#endif

  /* check for collision if necessary */
  if (!allow_dup && avl_find(&addr->_addrtlv_tree, &tlvtype->_full_type) != NULL) {
    return RFC5444_DUPLICATE_TLV;
  }

  if ((addrtlv = writer->malloc_addrtlv_entry()) == NULL) {
    /* out of memory error */
    return RFC5444_OUT_OF_MEMORY;
  }

  /* set back pointer */
  addrtlv->address = addr;
  addrtlv->tlvtype = tlvtype;

  /* copy value(length) */
  addrtlv->length = length;
  if (length > 0 && (addrtlv->value = _copy_addrtlv_value(writer, value, length)) == NULL) {
    writer->free_addrtlv_entry(addrtlv);
    return RFC5444_OUT_OF_ADDRTLV_MEM;
  }

  /* add to address tree */
  addrtlv->addrtlv_node.key = &tlvtype->_full_type;
  avl_insert(&addr->_addrtlv_tree, &addrtlv->addrtlv_node);

  return RFC5444_OKAY;
}